

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::Chapters::Atom::GetTime(Chapters *pChapters,longlong timecode)

{
  SegmentInfo *this;
  longlong lVar1;
  longlong result;
  longlong timecode_scale;
  SegmentInfo *pInfo;
  Segment *pSegment;
  longlong timecode_local;
  Chapters *pChapters_local;
  
  if (pChapters == (Chapters *)0x0) {
    pChapters_local = (Chapters *)0xffffffffffffffff;
  }
  else if (pChapters->m_pSegment == (Segment *)0x0) {
    pChapters_local = (Chapters *)0xffffffffffffffff;
  }
  else {
    this = Segment::GetInfo(pChapters->m_pSegment);
    if (this == (SegmentInfo *)0x0) {
      pChapters_local = (Chapters *)0xffffffffffffffff;
    }
    else {
      lVar1 = SegmentInfo::GetTimeCodeScale(this);
      if (lVar1 < 1) {
        pChapters_local = (Chapters *)0xffffffffffffffff;
      }
      else if (timecode < 0) {
        pChapters_local = (Chapters *)0xffffffffffffffff;
      }
      else {
        pChapters_local = (Chapters *)(lVar1 * timecode);
      }
    }
  }
  return (longlong)pChapters_local;
}

Assistant:

long long Chapters::Atom::GetTime(const Chapters* pChapters,
                                  long long timecode) {
  if (pChapters == NULL)
    return -1;

  Segment* const pSegment = pChapters->m_pSegment;

  if (pSegment == NULL)  // weird
    return -1;

  const SegmentInfo* const pInfo = pSegment->GetInfo();

  if (pInfo == NULL)
    return -1;

  const long long timecode_scale = pInfo->GetTimeCodeScale();

  if (timecode_scale < 1)  // weird
    return -1;

  if (timecode < 0)
    return -1;

  const long long result = timecode_scale * timecode;

  return result;
}